

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTabBar::text(QString *__return_storage_ptr__,QAccessibleTabBar *this,Text t)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  QTabBar *pQVar5;
  QTabBar *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (t == Accelerator) {
    pQVar5 = tabBar(this);
    this_00 = tabBar(this);
    iVar4 = QTabBar::currentIndex(this_00);
    this_01 = &local_48;
    QTabBar::tabText((QString *)this_01,pQVar5,iVar4);
    qt_accHotKey(__return_storage_ptr__,(QString *)this_01);
LAB_004cb3cc:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
  }
  else {
    if (t != Name) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_004cb40c;
    }
    pQVar5 = tabBar(this);
    iVar4 = QTabBar::currentIndex(pQVar5);
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QTabBar::accessibleTabName(__return_storage_ptr__,pQVar5,iVar4);
    if ((__return_storage_ptr__->d).size == 0) {
      this_01 = &local_60;
      QTabBar::tabText((QString *)this_01,pQVar5,iVar4);
      qt_accStripAmp((QString *)&local_48,(QString *)this_01);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_48.d;
      (__return_storage_ptr__->d).ptr = local_48.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pcVar3;
      local_48.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      goto LAB_004cb3cc;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_004cb40c:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTabBar::text(QAccessible::Text t) const
{
    if (t == QAccessible::Name) {
        const QTabBar *tBar = tabBar();
        int idx = tBar->currentIndex();
        QString str = tBar->accessibleTabName(idx);
        if (str.isEmpty())
            str = qt_accStripAmp(tBar->tabText(idx));
        return str;
    } else if (t == QAccessible::Accelerator) {
        return qt_accHotKey(tabBar()->tabText(tabBar()->currentIndex()));
    }
    return QString();
}